

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _treeBase.hpp
# Opt level: O3

void __thiscall
ft::
treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
::BSTerase(treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
           *this,iterator *position)

{
  Colour CVar1;
  treeNode<ft::pair<const_int,_int>_> *ptVar2;
  treeNode<ft::pair<const_int,_int>_> *ptVar3;
  treeNode<ft::pair<const_int,_int>_> *ptVar4;
  treeNode<ft::pair<const_int,_int>_> *ptVar5;
  treeNode<ft::pair<const_int,_int>_> *ptVar6;
  treeNode<ft::pair<const_int,_int>_> *x;
  Colour CVar7;
  bool bVar8;
  
  ptVar4 = (this->m_tree).NIL;
  ((this->m_tree).m_first)->parent->left = ptVar4;
  ((this->m_tree).m_last)->parent->right = ptVar4;
  ptVar2 = position->m_node;
  CVar7 = ptVar2->colour;
  ptVar5 = ptVar2->left;
  x = ptVar2->right;
  if (ptVar5 == ptVar4) {
    if ((this->m_tree).m_root == ptVar2) {
      (this->m_tree).m_root = x;
      ptVar4 = ptVar2->parent;
    }
    else {
      ptVar4 = ptVar2->parent;
      if (ptVar4->left == ptVar2) {
        ptVar4->left = x;
      }
      else if (ptVar4->right == ptVar2) {
        ptVar4->right = x;
      }
    }
    x->parent = ptVar4;
  }
  else if (x == ptVar4) {
    if ((this->m_tree).m_root == ptVar2) {
      (this->m_tree).m_root = ptVar5;
      ptVar4 = ptVar2->parent;
    }
    else {
      ptVar4 = ptVar2->parent;
      if (ptVar4->left == ptVar2) {
        ptVar4->left = ptVar5;
      }
      else if (ptVar4->right == ptVar2) {
        ptVar4->right = ptVar5;
      }
    }
    ptVar5->parent = ptVar4;
    x = ptVar5;
  }
  else {
    ptVar4 = position->m_tree->NIL;
    ptVar5 = ptVar2;
    ptVar6 = x;
    if (x == ptVar4) {
      do {
        ptVar3 = ptVar5->parent;
        ptVar4 = ptVar3->right;
        bVar8 = ptVar4 == ptVar5;
        ptVar5 = ptVar3;
      } while (bVar8);
    }
    else {
      do {
        ptVar3 = ptVar6;
        ptVar6 = ptVar3->left;
      } while (ptVar3->left != ptVar4);
      ptVar4 = ptVar3->right;
    }
    CVar1 = ptVar3->colour;
    ptVar5 = ptVar3->parent;
    if (ptVar5 == ptVar2) {
      ptVar4->parent = ptVar3;
      ptVar6 = (this->m_tree).m_root;
    }
    else {
      ptVar6 = (this->m_tree).m_root;
      if (ptVar6 == ptVar3) {
        (this->m_tree).m_root = ptVar4;
        ptVar6 = ptVar4;
      }
      else if (ptVar5->left == ptVar3) {
        ptVar5->left = ptVar4;
      }
      else if (ptVar5->right == ptVar3) {
        ptVar5->right = ptVar4;
        x = ptVar2->right;
      }
      ptVar4->parent = ptVar5;
      ptVar3->right = x;
      x->parent = ptVar3;
    }
    if (ptVar6 == ptVar2) {
      (this->m_tree).m_root = ptVar3;
      ptVar5 = ptVar2->parent;
    }
    else {
      ptVar5 = ptVar2->parent;
      if (ptVar5->left == ptVar2) {
        ptVar5->left = ptVar3;
      }
      else if (ptVar5->right == ptVar2) {
        ptVar5->right = ptVar3;
      }
    }
    ptVar3->parent = ptVar5;
    ptVar5 = ptVar2->left;
    ptVar3->left = ptVar5;
    ptVar5->parent = ptVar3;
    ptVar3->colour = CVar7;
    x = ptVar4;
    CVar7 = CVar1;
  }
  operator_delete(ptVar2);
  if (CVar7 == BLACK) {
    fixEraseViolation(this,x);
  }
  attach(this);
  return;
}

Assistant:

void	BSTerase(iterator position) {
		this->detach();

		node*	z = position.node();
		node*	y = z;
		node*	x = NULL;
		enum Colour	origYColour = y->colour;

		if (z->left == this->NIL()) { // z has only right child or no children
			x = z->right;
			this->transplant(z, z->right);
		}
		else if (z->right == this->NIL()) { // z has only left child
			x = z->left;
			this->transplant(z, z->left);
		}
		else { // z has two children
			iterator temp = position;
			++temp;
			y = temp.node();

			origYColour = y->colour;
			x = y->right;
			if (y->parent == z)
				x->parent = y;
			else {
				this->transplant(y, y->right);
				y->right = z->right;
				y->right->parent = y;
			}
			this->transplant(z, y);
			y->left = z->left;
			y->left->parent = y;
			y->colour = z->colour;
		}

		this->m_alloc.destroy(z);
		this->m_alloc.deallocate(z, 1);

		if (origYColour == BLACK) {
			this->fixEraseViolation(x);
		}

		this->attach();
	}